

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O0

shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> __thiscall
juzzlin::Argengine::Impl::addOptionCommon<std::function<void(std::__cxx11::string)>>
          (Impl *this,OptionSet *optionVariants,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,bool required,string *infoText)

{
  bool bVar1;
  __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> sVar2;
  OptionSet *in_stack_00000010;
  Impl *in_stack_00000018;
  OptionDefinitionSP existing;
  undefined7 in_stack_00000050;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *optionDefinition;
  element_type *this_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  bool *in_stack_ffffffffffffffb8;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_ffffffffffffffc0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc8;
  
  this_00 = in_RDI;
  getOptionDefinition(in_stack_00000018,in_stack_00000010);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffc0);
  if (bVar1) {
    std::
    __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(in_RCX);
    throwOptionExistingError
              ((Impl *)CONCAT17(required,in_stack_00000050),(OptionDefinition *)infoText);
  }
  std::
  make_shared<juzzlin::Argengine::Impl::OptionDefinition,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,std::function<void(std::__cxx11::string)>&,bool&,std::__cxx11::string_const&>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0) & 0xffffffff00ffffff));
  std::
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  ::push_back((vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
               *)this_00,(value_type *)in_RDI);
  std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>::~shared_ptr
            ((shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *)0x1314a3);
  sVar2.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  return (shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>)
         sVar2.
         super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<OptionDefinition> addOptionCommon(const OptionSet & optionVariants, CallbackType callback, bool required, const std::string & infoText)
    {
        if (const auto existing = getOptionDefinition(optionVariants)) {
            throwOptionExistingError(*existing);
        } else {
            const auto optionDefinition = std::make_shared<OptionDefinition>(optionVariants, callback, required, infoText);
            m_optionDefinitions.push_back(optionDefinition);
            return optionDefinition;
        }
    }